

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.c
# Opt level: O1

unsigned_long find_last_bit(unsigned_long *addr,unsigned_long size)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = size >> 6;
  if ((size & 0x3f) == 0) goto LAB_00d5e198;
  bVar2 = -(char)(size & 0x3f);
  uVar4 = (addr[uVar3] << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
  while( true ) {
    if (uVar4 != 0) {
      uVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      return (uVar3 << 6 | 0x3f) - (uVar1 ^ 0x3f);
    }
LAB_00d5e198:
    bVar5 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar5) break;
    uVar4 = addr[uVar3];
  }
  return size;
}

Assistant:

unsigned long find_last_bit(const unsigned long *addr, unsigned long size)
{
    unsigned long words;
    unsigned long tmp;

    /* Start at final word. */
    words = size / BITS_PER_LONG;

    /* Partial final word? */
    if (size & (BITS_PER_LONG-1)) {
        tmp = (addr[words] & (~0UL >> (BITS_PER_LONG
                                       - (size & (BITS_PER_LONG-1)))));
        if (tmp) {
            goto found;
        }
    }

    while (words) {
        tmp = addr[--words];
        if (tmp) {
        found:
            return words * BITS_PER_LONG + BITS_PER_LONG - 1 - clzl(tmp);
        }
    }

    /* Not found */
    return size;
}